

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeAddParseSchemaOp(Vdbe *p,int iDb,char *zWhere,u16 p5)

{
  Parse *pPVar1;
  int i;
  
  sqlite3VdbeAddOp4(p,0x95,iDb,0,0,zWhere,-6);
  i = 0;
  if (0 < (long)p->nOp) {
    p->aOp[(long)p->nOp + -1].p5 = p5;
    i = 0;
  }
  for (; i < p->db->nDb; i = i + 1) {
    sqlite3VdbeUsesBtree(p,i);
  }
  pPVar1 = p->pParse->pToplevel;
  if (pPVar1 == (Parse *)0x0) {
    pPVar1 = p->pParse;
  }
  pPVar1->mayAbort = '\x01';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeAddParseSchemaOp(Vdbe *p, int iDb, char *zWhere, u16 p5){
  int j;
  sqlite3VdbeAddOp4(p, OP_ParseSchema, iDb, 0, 0, zWhere, P4_DYNAMIC);
  sqlite3VdbeChangeP5(p, p5);
  for(j=0; j<p->db->nDb; j++) sqlite3VdbeUsesBtree(p, j);
  sqlite3MayAbort(p->pParse);
}